

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void __thiscall TPZFMatrix<long>::Read(TPZFMatrix<long> *this,TPZStream *buf,void *context)

{
  _func_int **pp_Var1;
  int64_t iVar2;
  int64_t iVar3;
  
  TPZBaseMatrix::Read((TPZBaseMatrix *)this,buf,context);
  pp_Var1 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
  iVar2 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  iVar3 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol = 0;
  (*pp_Var1[0xd])(this,iVar2,iVar3);
  (*buf->_vptr_TPZStream[0x1f])
            (buf,this->fElem,
             (ulong)(uint)((int)(this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol *
                          (int)(this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow));
  return;
}

Assistant:

void TPZFMatrix<TVar>::Read( TPZStream &buf, void *context ){ //ok
    if constexpr (std::is_same<TVar, TFad<6, REAL>>::value ||
                  std::is_same<TVar, Fad<float>>::value ||
                  std::is_same<TVar, Fad<double>>::value ||
                  std::is_same<TVar, Fad<long double>>::value||
                  std::is_same<TVar, TPZFlopCounter>::value) {
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" not implemented for this type\n";
        PZError<<"Aborting...";
        DebugStop();
    }
    TPZMatrix<TVar>::Read(buf,context);
    int64_t row = this->fRow;
    int64_t col = this->fCol;
    //this is odd, but necessary.
    this->fRow = this->fCol = 0;
    Resize(row,col);
    buf.Read(fElem,this->fRow*this->fCol);
}